

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TThreadsFactory.cpp
# Opt level: O2

void __thiscall TThreadsFactory::WaitForAllThreads(TThreadsFactory *this)

{
  uint uVar1;
  uint i;
  uint uVar2;
  
  for (uVar2 = 0; uVar1 = this->fMaxThreads, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    sem_wait((sem_t *)&this->fCreationLimiter);
  }
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    sem_post((sem_t *)&this->fCreationLimiter);
    uVar1 = this->fMaxThreads;
  }
  return;
}

Assistant:

void TThreadsFactory::WaitForAllThreads(void)
{
    /* Wait for all the threads to complete
     * Beware, this will lock any new thread creation
     */
    for (unsigned int i = 0; i < fMaxThreads; ++i)
        sem_wait(&fCreationLimiter);

    /* Unlock everything now */
    for (unsigned int i = 0; i < fMaxThreads; ++i)
        sem_post(&fCreationLimiter);
}